

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  CharFormat CVar7;
  int iVar8;
  ulong uVar9;
  ostream *poVar10;
  size_t i;
  ulong uVar11;
  long in_FS_OFFSET;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  CVar7 = PrintCharsAsStringTo<char>((s->_M_dataplus)._M_p,s->_M_string_length,os);
  if ((CVar7 != kAsIs) && (FLAGS_gtest_print_utf8 == '\x01')) {
    pcVar5 = (s->_M_dataplus)._M_p;
    uVar6 = s->_M_string_length;
    for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
      bVar2 = pcVar5[uVar11];
      iVar8 = iscntrl((uint)bVar2);
      if ((iVar8 != 0) && ((0xd < bVar2 || ((0x2600U >> (bVar2 & 0x1f) & 1) == 0))))
      goto LAB_00158905;
    }
    uVar11 = 0;
    do {
      while( true ) {
        while( true ) {
          do {
            do {
              uVar9 = uVar11;
              if (uVar6 <= uVar9) {
                poVar10 = std::operator<<(os,"\n    As Text: \"");
                poVar10 = std::operator<<(poVar10,pcVar5);
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
                  std::operator<<(poVar10,"\"");
                  return;
                }
                goto LAB_00158969;
              }
              uVar1 = uVar9 + 1;
              bVar2 = pcVar5[uVar9];
              uVar11 = uVar1;
            } while (-1 < (char)bVar2);
            if (bVar2 < 0xc2) goto LAB_00158905;
          } while (((bVar2 < 0xe0) && (uVar9 + 2 <= uVar6)) &&
                  (uVar11 = uVar9 + 2, pcVar5[uVar1] < -0x40));
          if ((bVar2 & 0xf0) != 0xe0) break;
          uVar11 = uVar9 + 3;
          if ((uVar6 < uVar11) ||
             ((bVar3 = pcVar5[uVar1], -0x41 < (char)bVar3 || (-0x41 < pcVar5[uVar9 + 2]))))
          goto LAB_00158905;
          if (bVar2 == 0xed) {
            if (0x9f < bVar3) goto LAB_00158905;
          }
          else if ((bVar2 == 0xe0) && (bVar3 < 0xa0)) goto LAB_00158905;
        }
        if (((4 < (byte)(bVar2 + 0x10)) || (uVar11 = uVar9 + 4, uVar6 < uVar11)) ||
           ((bVar3 = pcVar5[uVar1], -0x41 < (char)bVar3 ||
            ((-0x41 < pcVar5[uVar9 + 2] || (-0x41 < pcVar5[uVar9 + 3])))))) goto LAB_00158905;
        if (bVar2 == 0xf4) break;
        if ((bVar2 == 0xf0) && (bVar3 < 0x90)) goto LAB_00158905;
      }
    } while (bVar3 < 0x90);
  }
LAB_00158905:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_00158969:
  __stack_chk_fail();
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}